

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty_test.cc
# Opt level: O2

void __thiscall
BloatyTest_SimpleObjectFile_Test::BloatyTest_SimpleObjectFile_Test
          (BloatyTest_SimpleObjectFile_Test *this)

{
  BloatyTest::BloatyTest(&this->super_BloatyTest);
  (this->super_BloatyTest).super_Test._vptr_Test = (_func_int **)&PTR__BloatyTest_005fec28;
  return;
}

Assistant:

TEST_F(BloatyTest, SimpleObjectFile) {
  std::string file = "02-simple.o";
  uint64_t size;
  ASSERT_TRUE(GetFileSize(file, &size));

  // Test "-n 0" which should return an unlimited number of rows.
  RunBloaty({"bloaty", "-n", "0", file});
  EXPECT_GT(top_row_->size.vm, 64);
  EXPECT_LT(top_row_->size.vm, 300);
  EXPECT_EQ(top_row_->size.file, size);
  EXPECT_GT(top_row_->sorted_children.size(), 1);

  // Same with segments (we fake segments on .o files).
  RunBloaty({"bloaty", "-d", "segments", file});
  EXPECT_GT(top_row_->size.vm, 64);
  EXPECT_LT(top_row_->size.vm, 300);
  EXPECT_EQ(top_row_->size.file, size);
  EXPECT_GT(top_row_->sorted_children.size(), 1);

  // For inputfiles we should get everything attributed to the input file.
  RunBloaty({"bloaty", "-d", "inputfiles", file});
  AssertChildren(*top_row_, {
    std::make_tuple("02-simple.o", kUnknown, kUnknown)
  });

  // For symbols we should get entries for all our expected symbols.
  RunBloaty({"bloaty", "-d", "symbols", "-n", "40", "-s", "vm", file});
  AssertChildren(*top_row_, {
    std::make_tuple("func1", kUnknown, kSameAsVM),
    std::make_tuple("func2", kUnknown, kSameAsVM),
    std::make_tuple("bss_a", 8, 0),
    std::make_tuple("data_a", 8, 8),
    std::make_tuple("rodata_a", 8, 8),
    std::make_tuple("bss_b", 4, 0),
    std::make_tuple("data_b", 4, 4),
    std::make_tuple("rodata_b", 4, 4),
  });

  RunBloaty({"bloaty", "-d", "sections,symbols", "-n", "50", file});

  auto row = FindRow(".bss");
  ASSERT_TRUE(row != nullptr);
  AssertChildren(*row, {
    std::make_tuple("bss_a", 8, 0),
    std::make_tuple("bss_b", 4, 0),
  });

  row = FindRow(".data");
  ASSERT_TRUE(row != nullptr);
  AssertChildren(*row, {
    std::make_tuple("data_a", 8, 8),
    std::make_tuple("data_b", 4, 4),
  });

  row = FindRow(".rodata");
  ASSERT_TRUE(row != nullptr);
  AssertChildren(*row, {
    std::make_tuple("rodata_a", 8, 8),
    std::make_tuple("rodata_b", 4, 4),
  });
}